

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conjgrad.c
# Opt level: O3

int stopcheck2(double fx,int N,double *xc,double *xf,double *jac,double *dx,double fsval,double gtol
              ,double stol)

{
  double *array;
  ulong uVar1;
  int iVar2;
  double dVar3;
  double dVar4;
  
  array = (double *)malloc((long)N * 8);
  if (N < 1) {
    dVar4 = array_max_abs(array,N);
    iVar2 = 1;
    if (dVar4 <= gtol) goto LAB_001398de;
  }
  else {
    dVar4 = ABS(fx);
    if (ABS(fx) <= ABS(fsval)) {
      dVar4 = ABS(fsval);
    }
    uVar1 = 0;
    do {
      dVar3 = ABS(xf[uVar1]);
      if (ABS(xf[uVar1]) <= 1.0 / ABS(dx[uVar1])) {
        dVar3 = 1.0 / ABS(dx[uVar1]);
      }
      array[uVar1] = (ABS(jac[uVar1]) * dVar3) / dVar4;
      uVar1 = uVar1 + 1;
    } while ((uint)N != uVar1);
    dVar4 = array_max_abs(array,N);
    iVar2 = 1;
    if (dVar4 <= gtol) goto LAB_001398de;
    if (0 < N) {
      uVar1 = 0;
      do {
        dVar4 = ABS(xf[uVar1]);
        if (dVar4 <= 1.0 / ABS(dx[uVar1])) {
          dVar4 = 1.0 / ABS(dx[uVar1]);
        }
        array[uVar1] = ABS(xf[uVar1] - xc[uVar1]) / dVar4;
        uVar1 = uVar1 + 1;
      } while ((uint)N != uVar1);
    }
  }
  dVar4 = array_max_abs(array,N);
  iVar2 = 0;
  if (dVar4 <= stol) {
    iVar2 = 2;
  }
LAB_001398de:
  free(array);
  return iVar2;
}

Assistant:

int stopcheck2(double fx,int N,double *xc,double *xf,double *jac,double *dx,double fsval,double gtol,double stol) {
	int rcode,i;
	double num,den;
	double stop0;
	double *scheck;
	
	rcode = 0;	
	
	scheck = (double*) malloc(sizeof(double) *N);
	
	if (fabs(fx) > fabs(fsval)) {
			den = fabs(fx);
	} else {
			den = fabs(fsval);
	}
	for(i = 0; i < N;++i) {
		if (fabs(xf[i]) > 1.0 / fabs(dx[i])) {
			num = fabs(xf[i]);
		} else {
			num = 1.0 / fabs(dx[i]);
		}
		scheck[i] = fabs(jac[i]) * num / den;
	}
	
	stop0 = array_max_abs(scheck,N);
	
	if (stop0 <= gtol) {
		rcode = 1;
	} else {
		for(i = 0; i < N;++i) {
			if (fabs(xf[i]) > 1.0 / fabs(dx[i])) {
				den = fabs(xf[i]);
			} else {
				den = 1.0 / fabs(dx[i]);
			}
			num = fabs(xf[i] - xc[i]);
			scheck[i] = num / den;
		}
		stop0 = array_max_abs(scheck,N);
		if (stop0 <= stol) {
			rcode = 2;
		}
	}
	
	free(scheck);
	return rcode;
}